

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

void __thiscall MetaCommand::ListOptions(MetaCommand *this)

{
  ostream *poVar1;
  char *pcVar2;
  pointer pOVar3;
  int iVar4;
  pointer pFVar5;
  string local_50;
  
  iVar4 = 0;
  for (pOVar3 = (this->m_OptionVector).
                super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar3 != (this->m_OptionVector).
                super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                _M_impl.super__Vector_impl_data._M_finish; pOVar3 = pOVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Option #");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar4);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"   Name: ");
    poVar1 = std::operator<<(poVar1,(pOVar3->name)._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar1);
    if ((pOVar3->tag)._M_string_length != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"   Tag: ");
      poVar1 = std::operator<<(poVar1,(pOVar3->tag)._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"   Description: ");
    poVar1 = std::operator<<(poVar1,(pOVar3->description)._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar2 = "      Required: false";
    if (pOVar3->required != false) {
      pcVar2 = "      Required: true";
    }
    poVar1 = std::operator<<((ostream *)&std::cout,pcVar2 + 3);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"   Number of expected values: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    for (pFVar5 = (pOVar3->fields).
                  super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar5 != (pOVar3->fields).
                  super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"      Field Name: ");
      poVar1 = std::operator<<(poVar1,(pFVar5->name)._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"      Description: ");
      poVar1 = std::operator<<(poVar1,(pFVar5->description)._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar2 = "      Type: ";
      poVar1 = std::operator<<((ostream *)&std::cout,"      Type: ");
      TypeToString_abi_cxx11_(&local_50,(MetaCommand *)pcVar2,pFVar5->type);
      poVar1 = std::operator<<(poVar1,local_50._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_50);
      poVar1 = std::operator<<((ostream *)&std::cout,"      Value: ");
      poVar1 = std::operator<<(poVar1,(pFVar5->value)._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar2 = "      External Data: true";
      if (pFVar5->externaldata == DATA_NONE) {
        pcVar2 = "      External Data: false";
      }
      poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar2 = "      Required: false";
      if (pFVar5->required != false) {
        pcVar2 = "      Required: true";
      }
      poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar4 = iVar4 + 1;
  }
  if (this->m_HelpCallBack != (_func_void *)0x0) {
    (*this->m_HelpCallBack)();
  }
  return;
}

Assistant:

void MetaCommand::ListOptions()
{
  OptionVector::const_iterator it = m_OptionVector.begin();
  int i=0;
  while(it != m_OptionVector.end())
    {
    METAIO_STREAM::cout << "Option #" << i << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "   Name: " <<  (*it).name.c_str() << METAIO_STREAM::endl;
    if (!(*it).tag.empty()) {
      METAIO_STREAM::cout << "   Tag: " << (*it).tag.c_str() << METAIO_STREAM::endl;
    }
    METAIO_STREAM::cout << "   Description: " << (*it).description.c_str() << METAIO_STREAM::endl;
    if((*it).required)
      {
      METAIO_STREAM::cout << "   Required: true" << METAIO_STREAM::endl;
      }
    else
      {
      METAIO_STREAM::cout << "   Required: false" << METAIO_STREAM::endl;
      }
    METAIO_STREAM::cout << "   Number of expected values: " << (*it).fields.size()
                                              << METAIO_STREAM::endl;

    auto itField = (*it).fields.begin();
    while(itField != (*it).fields.end())
      {
      METAIO_STREAM::cout << "      Field Name: " <<  (*itField).name.c_str()
                                        << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "      Description: " << (*itField).description.c_str()
                                         << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "      Type: " << this->TypeToString((*itField).type).c_str()
                                  << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "      Value: " << (*itField).value.c_str() << METAIO_STREAM::endl;

      if((*itField).externaldata)
        {
        METAIO_STREAM::cout << "      External Data: true" << METAIO_STREAM::endl;
        }
      else
        {
        METAIO_STREAM::cout << "      External Data: false" << METAIO_STREAM::endl;
        }

      if((*itField).required)
        {
        METAIO_STREAM::cout << "      Required: true" << METAIO_STREAM::endl;
        }
      else
        {
        METAIO_STREAM::cout << "      Required: false" << METAIO_STREAM::endl;
        }
      ++itField;
      }
    METAIO_STREAM::cout << METAIO_STREAM::endl;
    ++i;
    ++it;
    }
    if (m_HelpCallBack != nullptr) {
      m_HelpCallBack();
    }
}